

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarextension.cpp
# Opt level: O0

void __thiscall QToolBarExtension::QToolBarExtension(QToolBarExtension *this,QWidget *parent)

{
  long lVar1;
  QLatin1StringView str;
  char *in_RSI;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Orientation o;
  undefined7 in_stack_ffffffffffffffc8;
  undefined7 uVar3;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 enable;
  QToolButton *in_stack_ffffffffffffffd0;
  QToolButton *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QToolButton::QToolButton
            (in_stack_ffffffffffffffd0,
             (QWidget *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  *(undefined ***)in_RDI = &PTR_metaObject_00d1f918;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QToolBarExtension_00d1fae8;
  *(undefined4 *)(in_RDI + 0x28) = 1;
  QVar2 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  uVar3 = (undefined7)QVar2.m_size;
  enable = QVar2.m_size._7_1_;
  this_00 = (QToolButton *)QVar2.m_data;
  str.m_data = in_RSI;
  str.m_size = (qsizetype)this_00;
  QAnyStringView::QAnyStringView((QAnyStringView *)QVar2.m_size,str);
  QObject::setObjectName(in_RDI);
  o = Horizontal;
  QToolButton::setAutoRaise(this_00,(bool)enable);
  setOrientation((QToolBarExtension *)CONCAT17(enable,uVar3),o);
  QWidget::setSizePolicy
            ((QWidget *)CONCAT44(o,in_stack_ffffffffffffffc0),(Policy)((ulong)in_RDI >> 0x20),
             (Policy)in_RDI);
  QAbstractButton::setCheckable
            ((QAbstractButton *)CONCAT44(o,in_stack_ffffffffffffffc0),SUB81((ulong)in_RDI >> 0x38,0)
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QToolBarExtension::QToolBarExtension(QWidget *parent)
    : QToolButton(parent)
    , m_orientation(Qt::Horizontal)
{
    setObjectName("qt_toolbar_ext_button"_L1);
    setAutoRaise(true);
    setOrientation(m_orientation);
    setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Minimum);
    setCheckable(true);
}